

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O0

void __thiscall yyFlexLexer::yy_delete_buffer(yyFlexLexer *this,YY_BUFFER_STATE b)

{
  YY_BUFFER_STATE local_30;
  YY_BUFFER_STATE b_local;
  yyFlexLexer *this_local;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
      local_30 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_30 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    }
    if (b == local_30) {
      this->yy_buffer_stack[this->yy_buffer_stack_top] = (yy_buffer_state *)0x0;
    }
    if (b->yy_is_our_buffer != 0) {
      yyfree(b->yy_ch_buf);
    }
    yyfree(b);
  }
  return;
}

Assistant:

void yyFlexLexer::yy_delete_buffer( YY_BUFFER_STATE b )
/* %endif */
{
    
	if ( ! b )
		return;

	if ( b == YY_CURRENT_BUFFER ) /* Not sure if we should pop here. */
		YY_CURRENT_BUFFER_LVALUE = (YY_BUFFER_STATE) 0;

	if ( b->yy_is_our_buffer )
		yyfree( (void *) b->yy_ch_buf  );

	yyfree( (void *) b  );
}